

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<int>::resizeImpl<slang::SmallVectorBase<int>::ValueInitTag>
          (SmallVectorBase<int> *this,size_type newSize,ValueInitTag *val)

{
  iterator piVar1;
  ValueInitTag *in_RSI;
  SmallVectorBase<int> *in_RDI;
  SmallVectorBase<int> *unaff_retaddr;
  ValueInitTag temp;
  iter_difference_t<int_*> in_stack_ffffffffffffffd0;
  __destroy_fn *in_stack_ffffffffffffffe0;
  
  if (in_RSI < (ValueInitTag *)in_RDI->len) {
    piVar1 = begin(in_RDI);
    piVar1 = piVar1 + (long)in_RSI;
    end(in_RDI);
    std::ranges::__destroy_fn::operator()<int_*,_int_*>
              (in_stack_ffffffffffffffe0,(int *)in_RDI,piVar1);
    in_RDI->len = (size_type)in_RSI;
  }
  else if ((ValueInitTag *)in_RDI->len < in_RSI) {
    if ((ValueInitTag *)in_RDI->cap < in_RSI) {
      resizeRealloc<slang::SmallVectorBase<int>::ValueInitTag>
                (unaff_retaddr,(size_type)in_RDI,in_RSI);
    }
    else {
      end(in_RDI);
      std::ranges::__uninitialized_value_construct_n_fn::operator()<int_*>
                ((__uninitialized_value_construct_n_fn *)in_stack_ffffffffffffffe0,(int *)in_RDI,
                 in_stack_ffffffffffffffd0);
      in_RDI->len = (size_type)in_RSI;
    }
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }